

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::DescriptorProto::_InternalParse(DescriptorProto *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  string *s;
  DescriptorProto_ExtensionRange *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_00;
  DescriptorProto *msg_00;
  EnumDescriptorProto *msg_01;
  OneofDescriptorProto *msg_02;
  FieldDescriptorProto *pFVar2;
  MessageOptions *msg_03;
  DescriptorProto_ReservedRange *msg_04;
  char cVar3;
  uint32 tag;
  char *local_68;
  uint local_5c;
  DescriptorProto *local_58;
  InternalMetadataWithArena *local_50;
  RepeatedPtrField<google::protobuf::OneofDescriptorProto> *local_48;
  RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange> *local_40;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_38;
  
  local_50 = &this->_internal_metadata_;
  local_38 = &this->reserved_name_;
  local_40 = &this->reserved_range_;
  local_48 = &this->oneof_decl_;
  local_68 = ptr;
  local_58 = this;
LAB_002b507f:
  do {
    bVar1 = internal::ParseContext::Done(ctx,&local_68);
    if (bVar1) {
      return local_68;
    }
    local_68 = internal::ReadTag(local_68,&local_5c,0);
    if (local_68 == (char *)0x0) {
      return (char *)0x0;
    }
    cVar3 = (char)local_5c;
    switch(local_5c >> 3) {
    case 1:
      if (cVar3 != '\n') break;
      s = _internal_mutable_name_abi_cxx11_(local_58);
      local_68 = internal::InlineGreedyStringParser(s,local_68,ctx);
      goto LAB_002b5390;
    case 2:
      if (cVar3 == '\x12') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          pFVar2 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&this->field_);
          local_68 = internal::ParseContext::ParseMessage<google::protobuf::FieldDescriptorProto>
                               (ctx,pFVar2,local_68);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == '\x12'));
        goto LAB_002b507f;
      }
      break;
    case 3:
      if (cVar3 == '\x1a') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          msg_00 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(&this->nested_type_);
          local_68 = internal::ParseContext::ParseMessage<google::protobuf::DescriptorProto>
                               (ctx,msg_00,local_68);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == '\x1a'));
        goto LAB_002b507f;
      }
      break;
    case 4:
      if (cVar3 == '\"') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          msg_01 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Add(&this->enum_type_);
          local_68 = internal::ParseContext::ParseMessage<google::protobuf::EnumDescriptorProto>
                               (ctx,msg_01,local_68);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == '\"'));
        goto LAB_002b507f;
      }
      break;
    case 5:
      if (cVar3 == '*') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          msg = RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::Add
                          (&this->extension_range_);
          local_68 = internal::ParseContext::
                     ParseMessage<google::protobuf::DescriptorProto_ExtensionRange>
                               (ctx,msg,local_68);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == '*'));
        goto LAB_002b507f;
      }
      break;
    case 6:
      if (cVar3 == '2') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          pFVar2 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&this->extension_);
          local_68 = internal::ParseContext::ParseMessage<google::protobuf::FieldDescriptorProto>
                               (ctx,pFVar2,local_68);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == '2'));
        goto LAB_002b507f;
      }
      break;
    case 7:
      if (cVar3 == ':') {
        msg_03 = _internal_mutable_options(local_58);
        local_68 = internal::ParseContext::ParseMessage<google::protobuf::MessageOptions>
                             (ctx,msg_03,local_68);
        goto LAB_002b5390;
      }
      break;
    case 8:
      if (cVar3 == 'B') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          msg_02 = RepeatedPtrField<google::protobuf::OneofDescriptorProto>::Add(local_48);
          local_68 = internal::ParseContext::ParseMessage<google::protobuf::OneofDescriptorProto>
                               (ctx,msg_02,local_68);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == 'B'));
        goto LAB_002b507f;
      }
      break;
    case 9:
      if (cVar3 == 'J') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          msg_04 = RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::Add(local_40);
          local_68 = internal::ParseContext::
                     ParseMessage<google::protobuf::DescriptorProto_ReservedRange>
                               (ctx,msg_04,local_68);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == 'J'));
        goto LAB_002b507f;
      }
      break;
    case 10:
      if (cVar3 == 'R') {
        local_68 = local_68 + -1;
        do {
          local_68 = local_68 + 1;
          s_00 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::Add(local_38);
          local_68 = internal::InlineGreedyStringParser(s_00,local_68,ctx);
          if (local_68 == (char *)0x0) {
            return (char *)0x0;
          }
        } while ((local_68 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_68 == 'R'));
        goto LAB_002b507f;
      }
    }
    if ((local_5c == 0) || ((local_5c & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_5c - 1;
      return local_68;
    }
    local_68 = internal::UnknownFieldParse(local_5c,local_50,local_68,ctx);
LAB_002b5390:
    if (local_68 == (char *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* DescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.DescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto field = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_field(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto nested_type = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_nested_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_enum_type(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<34>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<42>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.FieldDescriptorProto extension = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_extension(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.MessageOptions options = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
      case 8:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 66)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_oneof_decl(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<66>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
      case 9:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 74)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_reserved_range(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<74>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated string reserved_name = 10;
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 82)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_add_reserved_name(), ptr, ctx, "google.protobuf.DescriptorProto.reserved_name");
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<82>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}